

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file.c
# Opt level: O0

ALLEGRO_USTR * al_fget_ustr(ALLEGRO_FILE *f)

{
  _Bool _Var1;
  char *pcVar2;
  char buf [128];
  ALLEGRO_USTR *us;
  char *in_stack_ffffffffffffff68;
  ALLEGRO_USTR *in_stack_ffffffffffffff70;
  char *in_stack_ffffffffffffff78;
  ALLEGRO_USTR *in_stack_ffffffffffffff80;
  ALLEGRO_FILE *in_stack_ffffffffffffff88;
  ALLEGRO_USTR *local_8;
  
  pcVar2 = al_fgets(in_stack_ffffffffffffff88,(char *)in_stack_ffffffffffffff80,
                    (size_t)in_stack_ffffffffffffff78);
  if (pcVar2 == (char *)0x0) {
    local_8 = (ALLEGRO_USTR *)0x0;
  }
  else {
    local_8 = al_ustr_new((char *)0x175e04);
    do {
      al_ustr_append_cstr(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
      _Var1 = al_ustr_has_suffix_cstr(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
      if (_Var1) {
        return local_8;
      }
      pcVar2 = al_fgets(in_stack_ffffffffffffff88,(char *)in_stack_ffffffffffffff80,
                        (size_t)in_stack_ffffffffffffff78);
    } while (pcVar2 != (char *)0x0);
  }
  return local_8;
}

Assistant:

ALLEGRO_USTR *al_fget_ustr(ALLEGRO_FILE *f)
{
   ALLEGRO_USTR *us;
   char buf[128];

   if (!al_fgets(f, buf, sizeof(buf))) {
      return NULL;
   }

   us = al_ustr_new("");

   do {
      al_ustr_append_cstr(us, buf);
      if (al_ustr_has_suffix_cstr(us, "\n"))
         break;
   } while (al_fgets(f, buf, sizeof(buf)));

   return us;
}